

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleResource.cpp
# Opt level: O0

bool __thiscall SampleResource::load(SampleResource *this)

{
  ulong uVar1;
  undefined8 uVar2;
  long in_RDI;
  bool local_1;
  
  uVar1 = al_is_audio_installed();
  if ((uVar1 & 1) == 0) {
    uVar2 = std::__cxx11::string::c_str();
    debug_message("Skipped loading sample %s\n",uVar2);
    local_1 = true;
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    uVar2 = al_load_sample(uVar2);
    *(undefined8 *)(in_RDI + 8) = uVar2;
    if (*(long *)(in_RDI + 8) == 0) {
      uVar2 = std::__cxx11::string::c_str();
      debug_message("Error loading sample %s\n",uVar2);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool SampleResource::load(void)
{
   if (!al_is_audio_installed()) {
      debug_message("Skipped loading sample %s\n", filename.c_str());
      return true;
   }

   sample_data = al_load_sample(filename.c_str());
   if (!sample_data) {
      debug_message("Error loading sample %s\n", filename.c_str());
      return false;
   }

   return true;
}